

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall
SimpleLogger::findMinMaxRevNumInternal
          (SimpleLogger *this,bool *min_revnum_initialized,size_t *min_revnum,size_t *max_revnum,
          string *f_name)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  string ext;
  char *local_68 [2];
  char local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  lVar2 = std::__cxx11::string::rfind((char *)f_name,0x46a196,0xffffffffffffffff);
  if (lVar2 == -1) {
    return;
  }
  std::__cxx11::string::substr((ulong)local_68,(ulong)f_name);
  iVar1 = std::__cxx11::string::compare((char *)local_68);
  if ((iVar1 == 0) && (7 < f_name->_M_string_length)) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)f_name);
    std::__cxx11::string::operator=((string *)f_name,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    lVar2 = std::__cxx11::string::rfind((char *)f_name,0x46a196,0xffffffffffffffff);
    if (lVar2 == -1) goto LAB_00186424;
    std::__cxx11::string::substr((ulong)local_48,(ulong)f_name);
    std::__cxx11::string::operator=((string *)local_68,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    lVar2 = 1;
  }
  else {
    lVar2 = 0;
  }
  iVar1 = atoi(local_68[0]);
  uVar3 = (ulong)iVar1;
  uVar4 = lVar2 + uVar3;
  if (lVar2 + uVar3 < *max_revnum) {
    uVar4 = *max_revnum;
  }
  *max_revnum = uVar4;
  if (*min_revnum_initialized == true) {
    uVar4 = *min_revnum;
  }
  else {
    *min_revnum = uVar3;
    *min_revnum_initialized = true;
    uVar4 = uVar3;
  }
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  *min_revnum = uVar3;
LAB_00186424:
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void SimpleLogger::findMinMaxRevNumInternal(bool& min_revnum_initialized,
                                            size_t& min_revnum,
                                            size_t& max_revnum,
                                            std::string& f_name)
{
    size_t last_dot = f_name.rfind(".");
    if (last_dot == std::string::npos) return;

    bool comp_file = false;
    std::string ext = f_name.substr(last_dot + 1, f_name.size() - last_dot - 1);
    if (ext == "gz" && f_name.size() > 7) {
        // Compressed file: asdf.log.123.tar.gz => need to get 123.
        f_name = f_name.substr(0, f_name.size() - 7);
        last_dot = f_name.rfind(".");
        if (last_dot == std::string::npos) return;
        ext = f_name.substr(last_dot + 1, f_name.size() - last_dot - 1);
        comp_file = true;
    }

    size_t revnum = atoi(ext.c_str());
    max_revnum = std::max( max_revnum,
                           ( (comp_file) ? (revnum+1) : (revnum) ) );
    if (!min_revnum_initialized) {
        min_revnum = revnum;
        min_revnum_initialized = true;
    }
    min_revnum = std::min(min_revnum, revnum);
}